

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

int util_save_ticket_cb(ptls_save_ticket_t *_self,ptls_t *tls,ptls_iovec_t src)

{
  FILE *__stream;
  FILE *__s;
  int *piVar1;
  char *pcVar2;
  FILE *fp;
  st_util_save_ticket_t *self;
  ptls_t *tls_local;
  ptls_save_ticket_t *_self_local;
  ptls_iovec_t src_local;
  
  __s = fopen((char *)(_self + 1),"wb");
  __stream = _stderr;
  if (__s == (FILE *)0x0) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    fprintf(__stream,"failed to open file:%s:%s\n",_self + 1,pcVar2);
    src_local.len._4_4_ = 0x203;
  }
  else {
    fwrite(src.base,1,src.len,__s);
    fclose(__s);
    src_local.len._4_4_ = 0;
  }
  return src_local.len._4_4_;
}

Assistant:

static int util_save_ticket_cb(ptls_save_ticket_t *_self, ptls_t *tls, ptls_iovec_t src)
{
    struct st_util_save_ticket_t *self = (void *)_self;
    FILE *fp;

    if ((fp = fopen(self->fn, "wb")) == NULL) {
        fprintf(stderr, "failed to open file:%s:%s\n", self->fn, strerror(errno));
        return PTLS_ERROR_LIBRARY;
    }
    fwrite(src.base, 1, src.len, fp);
    fclose(fp);

    return 0;
}